

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_NFiles.cpp
# Opt level: O2

void __thiscall amrex::NFilesIter::SetDynamic(NFilesIter *this,int deciderproc)

{
  pointer piVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  
  this->deciderProc = deciderproc;
  uVar5 = (ulong)currentDeciderIndex;
  piVar1 = (this->availableDeciders).super_vector<int,_std::allocator<int>_>.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->availableDeciders).super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)piVar1 >> 2;
  if (((long)uVar5 < 0) || (lVar4 <= (long)uVar5)) {
    uVar5 = 0;
  }
  if (0 < lVar4) {
    if (deciderproc < 0 || this->nProcs <= deciderproc) {
      deciderproc = piVar1[uVar5 & 0xffffffff];
      this->deciderProc = deciderproc;
    }
    iVar2 = this->nOutFiles;
    if (this->groupSets == true) {
      iVar2 = deciderproc / iVar2;
    }
    else {
      if (*(int *)(ParallelContext::frames + 0x10) < iVar2) {
        iVar2 = *(int *)(ParallelContext::frames + 0x10);
      }
      iVar6 = 1;
      if (1 < iVar2) {
        iVar6 = iVar2;
      }
      iVar2 = deciderproc % ((this->nProcs + iVar6 + -1) / iVar6);
    }
    if (iVar2 == 0) {
      this->deciderProc = piVar1[uVar5 & 0xffffffff];
    }
  }
  lVar3 = (long)this->nSets + (long)(int)uVar5 + -1;
  iVar2 = (int)lVar3;
  currentDeciderIndex = 0;
  if (0 < iVar2) {
    currentDeciderIndex = iVar2;
  }
  if (lVar4 <= lVar3) {
    currentDeciderIndex = 0;
  }
  iVar2 = ParallelContext::get_inc_mpi_tag();
  this->deciderTag = iVar2;
  iVar2 = ParallelContext::get_inc_mpi_tag();
  this->coordinatorTag = iVar2;
  iVar2 = ParallelContext::get_inc_mpi_tag();
  this->doneTag = iVar2;
  iVar2 = ParallelContext::get_inc_mpi_tag();
  this->writeTag = iVar2;
  this->remainingWriters = this->nProcs;
  this->useStaticSetSelection = false;
  if (this->nOutFiles == this->nProcs) {
    this->useStaticSetSelection = true;
    this->coordinatorProc = 0;
    return;
  }
  std::
  vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ::clear(&(this->fileNumbersWriteOrder).
           super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
         );
  std::
  vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
  ::resize(&(this->fileNumbersWriteOrder).
            super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
           ,(long)this->nOutFiles);
  return;
}

Assistant:

void NFilesIter::SetDynamic(int deciderproc)
{
  deciderProc = deciderproc;
  // ---- we have to check currentDeciderIndex here also in case of
  // ---- different nfiles for plots and checkpoints
  if(currentDeciderIndex >= availableDeciders.size() || currentDeciderIndex < 0) {
    currentDeciderIndex = 0;
  }
  if(availableDeciders.size() > 0) {
    if(deciderProc < 0 || deciderProc >= nProcs) {
      deciderProc = availableDeciders[currentDeciderIndex];
    }
    if(NFilesIter::WhichSetPosition(deciderProc, nProcs, nOutFiles, groupSets) == 0) {
      // ---- the decider cannot have set position zero
      deciderProc = availableDeciders[currentDeciderIndex];
    }
  }
  currentDeciderIndex += nSets - 1;
  if(currentDeciderIndex >= availableDeciders.size() || currentDeciderIndex < 0) {
    currentDeciderIndex = 0;
  }
  if(myProc == deciderProc) {
    NFilesIter::WhichSetPosition(myProc, nProcs, nOutFiles, groupSets);
  }

  deciderTag = ParallelDescriptor::SeqNum();
  coordinatorTag = ParallelDescriptor::SeqNum();
  doneTag = ParallelDescriptor::SeqNum();
  writeTag = ParallelDescriptor::SeqNum();
  remainingWriters = nProcs;
  useStaticSetSelection = false;
  if(nOutFiles == nProcs) {
    useStaticSetSelection = true;
    coordinatorProc = ParallelDescriptor::IOProcessorNumber();
  } else {
    fileNumbersWriteOrder.clear();
    fileNumbersWriteOrder.resize(nOutFiles);
  }
}